

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O2

int32 rw::d3d8::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  Geometry *geometry;
  
  piVar1 = *(int **)((long)object + 0x98);
  iVar3 = 0;
  if ((piVar1 != (int *)0x0) && (iVar3 = 0, *piVar1 == 8)) {
    lVar2 = *(long *)(piVar1 + 2);
    iVar3 = (uint)*(ushort *)((long)piVar1 + 6) * 0x2c + 0x18;
    for (lVar4 = 0; (uint)*(ushort *)((long)piVar1 + 6) * 0x38 != (int)lVar4; lVar4 = lVar4 + 0x38)
    {
      iVar3 = iVar3 + *(int *)(lVar2 + 0xc + lVar4) * 2 +
              *(int *)(lVar2 + 4 + lVar4) * *(int *)(lVar2 + 8 + lVar4);
    }
  }
  return iVar3;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D8)
		return 0;

	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	InstanceData *inst = header->inst;
	int32 size = 12 + 4 + 4 + 4 + header->numMeshes*0x2C;
	for(int32 i = 0; i < header->numMeshes; i++){
		size += inst->numIndices*2 + inst->numVertices*inst->stride;
		inst++;
	}
	return size;
}